

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>::
emplaceRealloc<slang::ast::StreamingConcatenationExpression::StreamExpression>
          (SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression> *this,
          pointer pos,StreamExpression *args)

{
  ulong uVar1;
  undefined8 *puVar2;
  Expression *pEVar3;
  StreamExpression *__cur_1;
  pointer pSVar4;
  pointer pSVar5;
  pointer pSVar6;
  pointer pSVar7;
  _Optional_payload_base<unsigned_int> _Var8;
  _Optional_payload_base<unsigned_int> ctx;
  long lVar9;
  
  if (this->len == 0x555555555555555) {
    detail::throwLengthError();
  }
  _Var8 = (_Optional_payload_base<unsigned_int>)(this->len + 1);
  uVar1 = this->cap;
  ctx = (_Optional_payload_base<unsigned_int>)(uVar1 * 2);
  if ((ulong)_Var8 < (ulong)ctx) {
    _Var8 = ctx;
  }
  if (0x555555555555555 - uVar1 < uVar1) {
    _Var8._M_payload = (_Storage<unsigned_int,_true>)0x55555555;
    _Var8._M_engaged = true;
    _Var8._5_3_ = 0x55555;
  }
  lVar9 = (long)pos - (long)this->data_;
  pSVar4 = (pointer)operator_new((long)_Var8 * 0x18);
  *(_Optional_payload_base<unsigned_int> *)((long)pSVar4 + lVar9 + 0x10) =
       (args->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>;
  pEVar3 = args->withExpr;
  *(undefined8 *)((long)pSVar4 + lVar9) = (args->operand).ptr;
  ((undefined8 *)((long)pSVar4 + lVar9))[1] = pEVar3;
  pSVar7 = this->data_;
  pSVar5 = pSVar7 + this->len;
  pSVar6 = pSVar4;
  if (pSVar5 == pos) {
    for (; pSVar7 != pos; pSVar7 = pSVar7 + 1) {
      (pSVar6->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int> =
           (pSVar7->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>;
      pEVar3 = pSVar7->withExpr;
      (pSVar6->operand).ptr = (pSVar7->operand).ptr;
      pSVar6->withExpr = pEVar3;
      pSVar6 = pSVar6 + 1;
    }
  }
  else {
    for (; pSVar7 != pos; pSVar7 = pSVar7 + 1) {
      ctx = (pSVar7->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>;
      (pSVar6->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int> = ctx;
      pEVar3 = pSVar7->withExpr;
      (pSVar6->operand).ptr = (pSVar7->operand).ptr;
      pSVar6->withExpr = pEVar3;
      pSVar6 = pSVar6 + 1;
    }
    puVar2 = (undefined8 *)(lVar9 + (long)pSVar4);
    for (; pos != pSVar5; pos = pos + 1) {
      *(_Optional_payload_base<unsigned_int> *)(puVar2 + 5) =
           (pos->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>;
      pEVar3 = pos->withExpr;
      puVar2[3] = (pos->operand).ptr;
      puVar2[4] = pEVar3;
      puVar2 = puVar2 + 3;
    }
  }
  cleanup(this,(EVP_PKEY_CTX *)ctx);
  this->len = this->len + 1;
  this->cap = (size_type)_Var8;
  this->data_ = pSVar4;
  return (pointer)((long)pSVar4 + lVar9);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}